

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_dates.c
# Opt level: O2

void CGTFS_RecordCalendarDate(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  calendar_date_t *pcVar6;
  char **ppcVar7;
  byte bVar8;
  calendar_date_t a;
  char *field_values [3];
  char *field_names [3];
  
  bVar8 = 0;
  iVar1 = greatest_test_pre("calendar_date_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[2] = "exception_type";
      field_names[0] = "service_id";
      field_names[1] = "date";
      field_values[2] = "2";
      field_values[0] = "1000";
      field_values[1] = "20000101";
      read_calendar_date(&a,3,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("1000",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0011f227:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"1000\" != cd_1.service_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t("20000101",a.date,&greatest_type_info_string,(void *)0x0)
        ;
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011f227;
          greatest_info.msg = "\"20000101\" != cd_1.date";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          if (a.exception_type == ET_REMOVED) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_0011f265;
          }
          greatest_info.fail_line = 0x16;
          greatest_info.msg = "ET_REMOVED != cd_1.exception_type";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f3aa;
    }
LAB_0011f265:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("calendar_date_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    lVar4 = 0x14;
    pcVar5 = "SOME_ID1";
    pcVar6 = &a;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pcVar6 = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      pcVar6 = (calendar_date_t *)((long)pcVar6 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    pcVar5 = "SOME_ID1";
    pcVar6 = (calendar_date_t *)field_names;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pcVar6->service_id = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      pcVar6 = (calendar_date_t *)((long)pcVar6 + (ulong)bVar8 * -8 + 4);
    }
    pcVar5 = "SOME_ID2";
    ppcVar7 = field_values;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)ppcVar7 = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      ppcVar7 = (char **)((long)ppcVar7 + (ulong)bVar8 * -8 + 4);
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_calendar_date(&a,(calendar_date_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_date(&a,(calendar_date_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_calendar_date((calendar_date_t *)field_names,(calendar_date_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0011f352;
        }
        greatest_info.fail_line = 0x30;
        greatest_info.msg = "0 != equal_calendar_date(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x2f;
        greatest_info.msg = "0 != equal_calendar_date(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x2e;
      greatest_info.msg = "1 != equal_calendar_date(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_0011f3aa:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_0011f352:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordCalendarDate) {
    RUN_TEST(calendar_date_read);
    RUN_TEST(calendar_date_compare);
}